

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeHostSystemInformationCommand.cxx
# Opt level: O1

bool cmCMakeHostSystemInformationCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  void *__s1;
  long lVar3;
  string_view separator;
  string_view name;
  string_view name_00;
  char cVar4;
  int iVar5;
  uint uVar6;
  const_iterator cVar7;
  _Rb_tree_node_base *p_Var8;
  _anonymous_namespace_ *p_Var9;
  optional<cmWindowsRegistry::View> oVar10;
  size_t value_00;
  size_t value_01;
  char *value_02;
  size_t value_03;
  size_t value_04;
  size_t value_05;
  size_t value_06;
  size_t value_07;
  size_t value_08;
  size_t value_09;
  size_t value_10;
  size_t value_11;
  size_t value_12;
  size_t value_13;
  size_t value_14;
  size_t value_15;
  size_t value_16;
  size_t value_17;
  char *value_18;
  size_t value_19;
  char *value_20;
  char *value_21;
  char *value_22;
  char *value_23;
  char *value_24;
  cmExecutionStatus *status_00;
  cmMakefile *__rhs;
  size_type __rlen;
  _Storage<cmWindowsRegistry::View,_true> view;
  ulong uVar11;
  bool bVar12;
  bool bVar13;
  string_view value_25;
  string_view separator_00;
  string_view key;
  string_view separator_01;
  string_view value_26;
  string_view key_00;
  string_view separator_02;
  string_view value_27;
  string_view key_01;
  string_view value_28;
  string_view name_01;
  basic_string_view<char,_std::char_traits<char>_> __str;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  static_string_view name_02;
  static_string_view name_03;
  static_string_view name_04;
  static_string_view name_05;
  static_string_view name_06;
  static_string_view name_07;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string_view sVar14;
  cmWindowsRegistry registry;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> value;
  Arguments arguments;
  optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  result;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  invalidArgs;
  string vars;
  string result_list;
  string cmake_var_name;
  cmArgumentParser<Arguments> parser;
  size_t in_stack_fffffffffffffd28;
  _Alloc_hider in_stack_fffffffffffffd30;
  _Alloc_hider _Var15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0;
  char local_2b0;
  string local_2a0;
  char local_280;
  cmMakefile *local_278;
  undefined1 local_270 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  _Base_ptr local_250;
  size_t local_248;
  char *local_240;
  size_t local_238;
  char local_230;
  undefined7 uStack_22f;
  undefined2 local_220;
  undefined1 *local_218;
  long local_210;
  undefined1 local_208;
  undefined7 uStack_207;
  char *local_1f8;
  pointer local_1f0;
  char local_1e8;
  undefined7 uStack_1e7;
  string local_1d8;
  pointer local_1b8;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  undefined1 *local_190;
  char *pcStack_188;
  size_t local_180;
  size_t sStack_178;
  _Any_data local_170;
  _Manager_type local_160;
  _Invoker_type p_Stack_158;
  bool local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  char *local_108;
  size_t local_100;
  char local_f8;
  undefined7 uStack_f7;
  string local_e8;
  string *local_c8;
  pointer local_c0;
  cmMakefile *local_b8;
  ulong local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  long local_98;
  _Any_data _Stack_90;
  code *pcStack_80;
  undefined8 local_78;
  _Any_data _Stack_70;
  code *pcStack_60;
  undefined8 local_58;
  vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  vStack_50;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  uVar11 = (long)paVar2 - (long)pbVar1 >> 5;
  if (((uVar11 < 2) || (pbVar1->_M_string_length != 6)) ||
     (iVar5 = bcmp((pbVar1->_M_dataplus)._M_p,"RESULT",6), iVar5 != 0)) {
    local_270._0_8_ = &local_260;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_270,"missing RESULT specification.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_001ab481:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._0_8_ != &local_260) {
      operator_delete((void *)local_270._0_8_,(ulong)(local_260._M_allocated_capacity + 1));
    }
    return false;
  }
  if (((uVar11 < 4) || (pbVar1[2]._M_string_length != 5)) ||
     (iVar5 = bcmp(pbVar1[2]._M_dataplus._M_p,"QUERY",5), iVar5 != 0)) {
    local_270._0_8_ = &local_260;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_270,"missing QUERY specification","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    goto LAB_001ab481;
  }
  local_1b8 = pbVar1 + 1;
  if ((pbVar1[3]._M_string_length != 0x10) ||
     (iVar5 = bcmp(pbVar1[3]._M_dataplus._M_p,"WINDOWS_REGISTRY",0x10), iVar5 != 0)) {
    if ((cmCMakeHostSystemInformationCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
         ::info == '\0') &&
       (iVar5 = __cxa_guard_acquire(&cmCMakeHostSystemInformationCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                     ::info), iVar5 != 0)) {
      cmsys::SystemInformation::SystemInformation(&cmCMakeHostSystemInformationCommand::info);
      __cxa_atexit(cmsys::SystemInformation::~SystemInformation,
                   &cmCMakeHostSystemInformationCommand::info,&__dso_handle);
      __cxa_guard_release(&cmCMakeHostSystemInformationCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                           ::info);
    }
    if (cmCMakeHostSystemInformationCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
        ::initialized == '\0') {
      cmsys::SystemInformation::RunCPUCheck(&cmCMakeHostSystemInformationCommand::info);
      cmsys::SystemInformation::RunOSCheck(&cmCMakeHostSystemInformationCommand::info);
      cmsys::SystemInformation::RunMemoryCheck(&cmCMakeHostSystemInformationCommand::info);
      cmCMakeHostSystemInformationCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
      ::initialized = '\x01';
    }
    local_108 = &local_f8;
    local_100 = 0;
    local_f8 = '\0';
    bVar12 = (ulong)((long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start) < 0x80;
    if (!bVar12) {
      local_c8 = (string *)&status->Error;
      uVar11 = 3;
      local_c0 = pbVar1;
      do {
        std::__cxx11::string::_M_append
                  ((char *)&local_108,
                   (&(anonymous_namespace)::DELIM_abi_cxx11_)[(ulong)(local_100 != 0) * 4]);
        pbVar1 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_278 = (cmMakefile *)(uVar11 * 0x20);
        __s1 = *(void **)((long)&(pbVar1->_M_dataplus)._M_p +
                         (long)&(local_278->FindPackageRootPathStack).
                                super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                ._M_impl.super__Deque_impl_data._M_map);
        lVar3 = *(long *)((long)&(local_278->FindPackageRootPathStack).
                                 super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 ._M_impl.super__Deque_impl_data._M_map +
                         (long)&pbVar1->_M_string_length);
        _Var15._M_p = in_stack_fffffffffffffd30._M_p;
        local_b0 = uVar11;
        if ((lVar3 == 0x17) &&
           (iVar5 = bcmp(__s1,"NUMBER_OF_LOGICAL_CORES",0x17),
           _Var15._M_p = in_stack_fffffffffffffd30._M_p, iVar5 == 0)) {
          uVar6 = cmsys::SystemInformation::GetNumberOfLogicalCPU
                            (&cmCMakeHostSystemInformationCommand::info);
          (anonymous_namespace)::ValueToString_abi_cxx11_
                    ((string *)local_270,(_anonymous_namespace_ *)(ulong)uVar6,value_00);
LAB_001abc4a:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._0_8_ == &local_260) {
LAB_001abc78:
            local_2c0._M_allocated_capacity._4_4_ = local_260._M_allocated_capacity._4_4_;
            local_2c0._M_allocated_capacity._0_4_ = local_260._M_allocated_capacity._0_4_;
            local_2c0._12_4_ = local_260._12_4_;
            local_2c0._8_4_ = local_260._8_4_;
            _Var15._M_p = (pointer)&local_2c0;
          }
          else {
LAB_001abc61:
            local_2c0._M_allocated_capacity = local_260._M_allocated_capacity;
            _Var15._M_p = (pointer)local_270._0_8_;
          }
          local_2c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_270._8_8_;
          local_2b0 = '\x01';
        }
        else {
          if ((lVar3 == 0x18) && (iVar5 = bcmp(__s1,"NUMBER_OF_PHYSICAL_CORES",0x18), iVar5 == 0)) {
            uVar6 = cmsys::SystemInformation::GetNumberOfPhysicalCPU
                              (&cmCMakeHostSystemInformationCommand::info);
            (anonymous_namespace)::ValueToString_abi_cxx11_
                      ((string *)local_270,(_anonymous_namespace_ *)(ulong)uVar6,value_01);
            goto LAB_001abc4a;
          }
          if ((lVar3 == 8) && (iVar5 = bcmp(__s1,"HOSTNAME",8), iVar5 == 0)) {
            p_Var9 = (_anonymous_namespace_ *)
                     cmsys::SystemInformation::GetHostname
                               (&cmCMakeHostSystemInformationCommand::info);
            (anonymous_namespace)::ValueToString_abi_cxx11_((string *)local_270,p_Var9,value_02);
            goto LAB_001abc4a;
          }
          if (lVar3 == 0x14) {
            iVar5 = bcmp(__s1,"TOTAL_VIRTUAL_MEMORY",0x14);
            if (iVar5 != 0) goto LAB_001ab706;
            p_Var9 = (_anonymous_namespace_ *)
                     cmsys::SystemInformation::GetTotalVirtualMemory
                               (&cmCMakeHostSystemInformationCommand::info);
            (anonymous_namespace)::ValueToString_abi_cxx11_((string *)local_270,p_Var9,value_03);
            goto LAB_001abc4a;
          }
          if ((lVar3 != 4) || (iVar5 = bcmp(__s1,"FQDN",4), iVar5 != 0)) {
LAB_001ab706:
            if ((lVar3 == 0x18) && (iVar5 = bcmp(__s1,"AVAILABLE_VIRTUAL_MEMORY",0x18), iVar5 == 0))
            {
              p_Var9 = (_anonymous_namespace_ *)
                       cmsys::SystemInformation::GetAvailableVirtualMemory
                                 (&cmCMakeHostSystemInformationCommand::info);
              (anonymous_namespace)::ValueToString_abi_cxx11_((string *)local_270,p_Var9,value_04);
              goto LAB_001abc4a;
            }
            if ((lVar3 == 0x15) && (iVar5 = bcmp(__s1,"TOTAL_PHYSICAL_MEMORY",0x15), iVar5 == 0)) {
              p_Var9 = (_anonymous_namespace_ *)
                       cmsys::SystemInformation::GetTotalPhysicalMemory
                                 (&cmCMakeHostSystemInformationCommand::info);
              (anonymous_namespace)::ValueToString_abi_cxx11_((string *)local_270,p_Var9,value_05);
              goto LAB_001abc4a;
            }
            if ((lVar3 == 0x19) && (iVar5 = bcmp(__s1,"AVAILABLE_PHYSICAL_MEMORY",0x19), iVar5 == 0)
               ) {
              p_Var9 = (_anonymous_namespace_ *)
                       cmsys::SystemInformation::GetAvailablePhysicalMemory
                                 (&cmCMakeHostSystemInformationCommand::info);
              (anonymous_namespace)::ValueToString_abi_cxx11_((string *)local_270,p_Var9,value_06);
              goto LAB_001abc4a;
            }
            if ((lVar3 == 8) && (iVar5 = bcmp(__s1,"IS_64BIT",8), iVar5 == 0)) {
              bVar13 = cmsys::SystemInformation::Is64Bits
                                 (&cmCMakeHostSystemInformationCommand::info);
              (anonymous_namespace)::ValueToString_abi_cxx11_
                        ((string *)local_270,(_anonymous_namespace_ *)(ulong)bVar13,value_07);
              goto LAB_001abc4a;
            }
            if (lVar3 == 7) {
              iVar5 = bcmp(__s1,"HAS_FPU",7);
              if (iVar5 == 0) {
                bVar13 = cmsys::SystemInformation::DoesCPUSupportFeature
                                   (&cmCMakeHostSystemInformationCommand::info,0x800000);
                (anonymous_namespace)::ValueToString_abi_cxx11_
                          ((string *)local_270,(_anonymous_namespace_ *)(ulong)bVar13,value_08);
              }
              else {
                iVar5 = bcmp(__s1,"HAS_MMX",7);
                if (iVar5 != 0) goto LAB_001ab7c0;
                bVar13 = cmsys::SystemInformation::DoesCPUSupportFeature
                                   (&cmCMakeHostSystemInformationCommand::info,1);
                (anonymous_namespace)::ValueToString_abi_cxx11_
                          ((string *)local_270,(_anonymous_namespace_ *)(ulong)bVar13,value_10);
              }
              goto LAB_001abc4a;
            }
LAB_001ab7c0:
            if ((lVar3 == 0xc) && (iVar5 = bcmp(__s1,"HAS_MMX_PLUS",0xc), iVar5 == 0)) {
              bVar13 = cmsys::SystemInformation::DoesCPUSupportFeature
                                 (&cmCMakeHostSystemInformationCommand::info,2);
              (anonymous_namespace)::ValueToString_abi_cxx11_
                        ((string *)local_270,(_anonymous_namespace_ *)(ulong)bVar13,value_09);
              goto LAB_001abc4a;
            }
            if ((lVar3 == 7) && (iVar5 = bcmp(__s1,"HAS_SSE",7), iVar5 == 0)) {
              bVar13 = cmsys::SystemInformation::DoesCPUSupportFeature
                                 (&cmCMakeHostSystemInformationCommand::info,4);
              (anonymous_namespace)::ValueToString_abi_cxx11_
                        ((string *)local_270,(_anonymous_namespace_ *)(ulong)bVar13,value_11);
              goto LAB_001abc4a;
            }
            if ((lVar3 == 8) && (iVar5 = bcmp(__s1,"HAS_SSE2",8), iVar5 == 0)) {
              bVar13 = cmsys::SystemInformation::DoesCPUSupportFeature
                                 (&cmCMakeHostSystemInformationCommand::info,8);
              (anonymous_namespace)::ValueToString_abi_cxx11_
                        ((string *)local_270,(_anonymous_namespace_ *)(ulong)bVar13,value_12);
            }
            else if ((lVar3 == 10) && (iVar5 = bcmp(__s1,"HAS_SSE_FP",10), iVar5 == 0)) {
              bVar13 = cmsys::SystemInformation::DoesCPUSupportFeature
                                 (&cmCMakeHostSystemInformationCommand::info,0x800);
              (anonymous_namespace)::ValueToString_abi_cxx11_
                        ((string *)local_270,(_anonymous_namespace_ *)(ulong)bVar13,value_13);
            }
            else if ((lVar3 == 0xb) && (iVar5 = bcmp(__s1,"HAS_SSE_MMX",0xb), iVar5 == 0)) {
              bVar13 = cmsys::SystemInformation::DoesCPUSupportFeature
                                 (&cmCMakeHostSystemInformationCommand::info,0x1000);
              (anonymous_namespace)::ValueToString_abi_cxx11_
                        ((string *)local_270,(_anonymous_namespace_ *)(ulong)bVar13,value_14);
            }
            else if (lVar3 == 0x12) {
              iVar5 = bcmp(__s1,"HAS_AMD_3DNOW_PLUS",0x12);
              if (iVar5 != 0) goto LAB_001ab8a6;
              bVar13 = cmsys::SystemInformation::DoesCPUSupportFeature
                                 (&cmCMakeHostSystemInformationCommand::info,0x20);
              (anonymous_namespace)::ValueToString_abi_cxx11_
                        ((string *)local_270,(_anonymous_namespace_ *)(ulong)bVar13,value_15);
            }
            else if ((lVar3 == 0xd) && (iVar5 = bcmp(__s1,"HAS_AMD_3DNOW",0xd), iVar5 == 0)) {
              bVar13 = cmsys::SystemInformation::DoesCPUSupportFeature
                                 (&cmCMakeHostSystemInformationCommand::info,0x10);
              (anonymous_namespace)::ValueToString_abi_cxx11_
                        ((string *)local_270,(_anonymous_namespace_ *)(ulong)bVar13,value_17);
            }
            else {
LAB_001ab8a6:
              if ((lVar3 == 8) && (iVar5 = bcmp(__s1,"HAS_IA64",8), iVar5 == 0)) {
                bVar13 = cmsys::SystemInformation::DoesCPUSupportFeature
                                   (&cmCMakeHostSystemInformationCommand::info,0x40);
                (anonymous_namespace)::ValueToString_abi_cxx11_
                          ((string *)local_270,(_anonymous_namespace_ *)(ulong)bVar13,value_16);
              }
              else if (lVar3 == 0xe) {
                iVar5 = bcmp(__s1,"PROCESSOR_NAME",0xe);
                if (iVar5 != 0) goto LAB_001ab90c;
                p_Var9 = (_anonymous_namespace_ *)
                         cmsys::SystemInformation::GetExtendedProcessorName
                                   (&cmCMakeHostSystemInformationCommand::info);
                (anonymous_namespace)::ValueToString_abi_cxx11_((string *)local_270,p_Var9,value_18)
                ;
              }
              else if ((lVar3 == 0x11) && (iVar5 = bcmp(__s1,"HAS_SERIAL_NUMBER",0x11), iVar5 == 0))
              {
                bVar13 = cmsys::SystemInformation::DoesCPUSupportFeature
                                   (&cmCMakeHostSystemInformationCommand::info,0x200);
                (anonymous_namespace)::ValueToString_abi_cxx11_
                          ((string *)local_270,(_anonymous_namespace_ *)(ulong)bVar13,value_19);
              }
              else {
LAB_001ab90c:
                if ((lVar3 == 0x15) && (iVar5 = bcmp(__s1,"PROCESSOR_DESCRIPTION",0x15), iVar5 == 0)
                   ) {
                  cmsys::SystemInformation::GetCPUDescription_abi_cxx11_
                            ((string *)local_270,&cmCMakeHostSystemInformationCommand::info);
                }
                else if ((lVar3 == 0x17) &&
                        (iVar5 = bcmp(__s1,"PROCESSOR_SERIAL_NUMBER",0x17), iVar5 == 0)) {
                  p_Var9 = (_anonymous_namespace_ *)
                           cmsys::SystemInformation::GetProcessorSerialNumber
                                     (&cmCMakeHostSystemInformationCommand::info);
                  (anonymous_namespace)::ValueToString_abi_cxx11_
                            ((string *)local_270,p_Var9,value_20);
                }
                else {
                  if ((lVar3 != 7) || (iVar5 = bcmp(__s1,"OS_NAME",7), iVar5 != 0)) {
                    if (lVar3 == 10) {
                      iVar5 = bcmp(__s1,"OS_RELEASE",10);
                      if (iVar5 == 0) {
                        p_Var9 = (_anonymous_namespace_ *)
                                 cmsys::SystemInformation::GetOSRelease
                                           (&cmCMakeHostSystemInformationCommand::info);
                        (anonymous_namespace)::ValueToString_abi_cxx11_
                                  ((string *)local_270,p_Var9,value_22);
                        goto LAB_001ac36f;
                      }
                      iVar5 = bcmp(__s1,"OS_VERSION",10);
                      if (iVar5 != 0) goto LAB_001ab9a6;
                      p_Var9 = (_anonymous_namespace_ *)
                               cmsys::SystemInformation::GetOSVersion
                                         (&cmCMakeHostSystemInformationCommand::info);
                      (anonymous_namespace)::ValueToString_abi_cxx11_
                                ((string *)local_270,p_Var9,value_24);
                    }
                    else {
LAB_001ab9a6:
                      if ((lVar3 != 0xb) || (iVar5 = bcmp(__s1,"OS_PLATFORM",0xb), iVar5 != 0)) {
                        local_2b0 = '\0';
                        goto LAB_001abc8f;
                      }
                      p_Var9 = (_anonymous_namespace_ *)
                               cmsys::SystemInformation::GetOSPlatform
                                         (&cmCMakeHostSystemInformationCommand::info);
                      (anonymous_namespace)::ValueToString_abi_cxx11_
                                ((string *)local_270,p_Var9,value_23);
                    }
                    _Var15._M_p = (pointer)local_270._0_8_;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_270._0_8_ == &local_260) {
                      local_2c0._8_8_ = local_260._8_8_;
                      _Var15._M_p = (pointer)&local_2c0;
                    }
                    local_2c0._M_allocated_capacity = local_260._M_allocated_capacity;
                    local_2c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_270._8_8_;
                    local_2b0 = '\x01';
                    goto LAB_001abc8f;
                  }
                  p_Var9 = (_anonymous_namespace_ *)
                           cmsys::SystemInformation::GetOSName
                                     (&cmCMakeHostSystemInformationCommand::info);
                  (anonymous_namespace)::ValueToString_abi_cxx11_
                            ((string *)local_270,p_Var9,value_21);
                }
              }
            }
LAB_001ac36f:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_270._0_8_ == &local_260) {
              goto LAB_001abc78;
            }
            goto LAB_001abc61;
          }
          cmsys::SystemInformation::GetFullyQualifiedDomainName_abi_cxx11_
                    ((string *)&local_a8,&cmCMakeHostSystemInformationCommand::info);
          local_270._0_8_ = &local_260;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_270,local_a8._M_allocated_capacity,
                     (undefined1 *)(local_a8._M_allocated_capacity + local_a8._8_8_));
          _Var15._M_p = (pointer)local_270._0_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._0_8_ == &local_260) {
            local_2c0._8_8_ = local_260._8_8_;
            _Var15._M_p = (pointer)&local_2c0;
          }
          local_2c0._M_allocated_capacity = local_260._M_allocated_capacity;
          local_2c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_270._8_8_;
          local_270._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_260._M_allocated_capacity = local_260._M_allocated_capacity & 0xffffffffffffff00;
          local_2b0 = '\x01';
          local_270._0_8_ = &local_260;
          if ((long *)local_a8._M_allocated_capacity != &local_98) {
            operator_delete((void *)local_a8._M_allocated_capacity,local_98 + 1);
          }
        }
LAB_001abc8f:
        in_stack_fffffffffffffd30._M_p = (pointer)&local_2c0;
        __rhs = (cmMakefile *)
                ((long)&(local_278->FindPackageRootPathStack).
                        super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Deque_impl_data._M_map + (long)&(pbVar1->_M_dataplus)._M_p);
        if (local_2b0 == '\x01') {
          local_2a0._M_dataplus._M_p = _Var15._M_p;
          if (_Var15._M_p == in_stack_fffffffffffffd30._M_p) {
            local_2a0.field_2._8_8_ = local_2c0._8_8_;
            local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
          }
          local_2a0.field_2._M_allocated_capacity = local_2c0._M_allocated_capacity;
          local_2a0._M_string_length = (size_type)local_2c8;
          local_2c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0;
          local_2c0._M_allocated_capacity = local_2c0._M_allocated_capacity & 0xffffffffffffff00;
          local_280 = '\x01';
        }
        else {
          local_270._8_8_ =
               (__rhs->FindPackageRootPathStack).
               super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_map;
          local_270._0_8_ =
               (__rhs->FindPackageRootPathStack).
               super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_map_size;
          p_Var9 = (_anonymous_namespace_ *)0x0;
          __str._M_str = "DISTRIB_";
          __str._M_len = 8;
          iVar5 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                            ((basic_string_view<char,_std::char_traits<char>_> *)local_270,0,8,__str
                            );
          in_stack_fffffffffffffd30._M_p = _Var15._M_p;
          if (iVar5 == 0) {
            local_278 = __rhs;
            if (((anonymous_namespace)::
                 GetValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                 ::s_os_release_abi_cxx11_ == '\0') &&
               (iVar5 = __cxa_guard_acquire(&(anonymous_namespace)::
                                             GetValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                                             ::s_os_release_abi_cxx11_),
               in_stack_fffffffffffffd30._M_p = _Var15._M_p, iVar5 != 0)) {
              (anonymous_namespace)::GetOSReleaseVariables_abi_cxx11_
                        ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)status,p_Var9,status_00);
              __cxa_atexit(std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::~map,(anonymous_namespace)::
                                  GetValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                                  ::s_os_release_abi_cxx11_,&__dso_handle);
              __cxa_guard_release(&(anonymous_namespace)::
                                   GetValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                                   ::s_os_release_abi_cxx11_);
              __rhs = local_278;
              in_stack_fffffffffffffd30._M_p = _Var15._M_p;
            }
            local_b8 = status->Makefile;
            std::__cxx11::string::substr((ulong)&local_148,(ulong)__rhs);
            if ((local_148._8_8_ == 4) &&
               (iVar5 = bcmp((void *)local_148._M_allocated_capacity,"INFO",4), iVar5 == 0)) {
              local_128.Begin._M_current =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_118;
              local_128.End._M_current =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              local_118._M_local_buf[0] = '\0';
              for (p_Var8 = (_Rb_tree_node_base *)
                            (anonymous_namespace)::
                            GetValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                            ::s_os_release_abi_cxx11_._24_8_;
                  p_Var8 != (_Rb_tree_node_base *)
                            ((anonymous_namespace)::
                             GetValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                             ::s_os_release_abi_cxx11_ + 8);
                  p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
                local_270._8_8_ = local_c0[1]._M_dataplus._M_p;
                local_270._0_8_ = local_c0[1]._M_string_length;
                local_a8._M_allocated_capacity = (size_type)&DAT_00000001;
                local_260._8_8_ = &local_98;
                local_98 = CONCAT71(local_98._1_7_,0x5f);
                local_260._M_allocated_capacity = (size_type)&DAT_00000001;
                local_248 = *(size_t *)(p_Var8 + 1);
                local_250 = p_Var8[1]._M_parent;
                views._M_len = 3;
                views._M_array = (iterator)local_270;
                local_a8._8_8_ = local_260._8_8_;
                cmCatViews_abi_cxx11_(&local_e8,views);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_270,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (&(anonymous_namespace)::DELIM_abi_cxx11_ +
                               (ulong)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                        *)local_128.End._M_current !=
                                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)0x0) * 4),&local_e8);
                std::__cxx11::string::_M_append((char *)&local_128,local_270._0_8_);
                __rhs = local_278;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_270._0_8_ != &local_260) {
                  operator_delete((void *)local_270._0_8_,
                                  (ulong)(local_260._M_allocated_capacity + 1));
                }
                sVar14._M_str = *(char **)(p_Var8 + 2);
                sVar14._M_len = (size_t)p_Var8[2]._M_parent;
                cmMakefile::AddDefinition(local_b8,&local_e8,sVar14);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                  operator_delete(local_e8._M_dataplus._M_p,
                                  local_e8.field_2._M_allocated_capacity + 1);
                }
              }
              local_1b0._0_8_ = &local_1a0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_128.Begin._M_current == &local_118) {
                local_1a0._8_8_ = local_118._8_8_;
              }
              else {
                local_1b0._0_8_ = local_128.Begin._M_current;
              }
              local_1a0._M_allocated_capacity._1_7_ = local_118._M_allocated_capacity._1_7_;
              local_1a0._M_local_buf[0] = local_118._M_local_buf[0];
              local_1b0._8_8_ = local_128.End._M_current;
            }
            else {
              cVar7 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)(anonymous_namespace)::
                                GetValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                                ::s_os_release_abi_cxx11_,(key_type *)&local_148);
              local_1b0._0_8_ = &local_1a0;
              if (cVar7._M_node ==
                  (_Base_ptr)
                  ((anonymous_namespace)::
                   GetValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                   ::s_os_release_abi_cxx11_ + 8)) {
                local_270._0_8_ = &local_260;
                local_270._8_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                local_260._M_allocated_capacity =
                     local_260._M_allocated_capacity & 0xffffffffffffff00;
                local_1a0._M_allocated_capacity = local_260._M_allocated_capacity;
                local_1a0._8_8_ = local_260._8_8_;
                local_1b0._8_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
              }
              else {
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_1b0,*(long *)(cVar7._M_node + 2),
                           (long)&(cVar7._M_node[2]._M_parent)->_M_color +
                           *(long *)(cVar7._M_node + 2));
              }
            }
            local_190 = (undefined1 *)CONCAT71(local_190._1_7_,1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_allocated_capacity != &local_138) {
              operator_delete((void *)local_148._M_allocated_capacity,
                              local_138._M_allocated_capacity + 1);
            }
          }
          else {
            local_190 = (undefined1 *)((ulong)local_190 & 0xffffffffffffff00);
          }
          if (local_190._0_1_ == true) {
            local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b0._0_8_ == &local_1a0) {
              local_2a0.field_2._8_8_ = local_1a0._8_8_;
            }
            else {
              local_2a0._M_dataplus._M_p = (pointer)local_1b0._0_8_;
            }
            local_2a0.field_2._M_allocated_capacity = local_1a0._M_allocated_capacity;
            local_2a0._M_string_length = local_1b0._8_8_;
            local_1b0._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_1a0._M_allocated_capacity = local_1a0._M_allocated_capacity & 0xffffffffffffff00;
            local_280 = '\x01';
            local_1b0._0_8_ = &local_1a0;
          }
          else {
            local_280 = '\0';
          }
          if ((local_190._0_1_ != false) &&
             (local_190 = (undefined1 *)((ulong)local_190 & 0xffffffffffffff00),
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_1b0._0_8_ != &local_1a0)) {
            operator_delete((void *)local_1b0._0_8_,(ulong)(local_1a0._M_allocated_capacity + 1));
          }
        }
        if ((local_2b0 == '\x01') &&
           (local_2b0 = '\0',
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)in_stack_fffffffffffffd30._M_p != &local_2c0)) {
          operator_delete(in_stack_fffffffffffffd30._M_p,
                          (ulong)(local_2c0._M_allocated_capacity + 1));
        }
        cVar4 = local_280;
        if (local_280 == '\0') {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_270,"does not recognize <key> ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs)
          ;
          std::__cxx11::string::_M_assign(local_c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._0_8_ != &local_260) {
            operator_delete((void *)local_270._0_8_,(ulong)(local_260._M_allocated_capacity + 1));
          }
        }
        else {
          std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_2a0._M_dataplus._M_p);
        }
        if ((local_280 == '\x01') &&
           (local_280 = '\0',
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_2a0._M_dataplus._M_p != &local_2a0.field_2)) {
          operator_delete(local_2a0._M_dataplus._M_p,
                          (ulong)(local_2a0.field_2._M_allocated_capacity + 1));
        }
        if (cVar4 == '\0') goto LAB_001ab5c8;
        uVar11 = local_b0 + 1;
        bVar13 = uVar11 < (ulong)((long)(args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start >> 5);
        bVar12 = !bVar13;
      } while (bVar13);
    }
    value_25._M_str = local_108;
    value_25._M_len = local_100;
    cmMakefile::AddDefinition(status->Makefile,local_1b8,value_25);
LAB_001ab5c8:
    if (local_108 == &local_f8) {
      return bVar12;
    }
    operator_delete(local_108,CONCAT71(uStack_f7,local_f8) + 1);
    return bVar12;
  }
  local_128.Begin._M_current = pbVar1 + 4;
  local_128.End._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128.Begin._M_current == paVar2) {
    local_270._0_8_ = &local_260;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_270,"missing <key> specification.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    goto LAB_001ab481;
  }
  vStack_50.
  super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_50.
  super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58 = 0;
  vStack_50.
  super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  _Stack_70._8_8_ = 0;
  pcStack_60 = (code *)0x0;
  local_78 = 0;
  _Stack_70._M_unused._M_object = (void *)0x0;
  _Stack_90._8_8_ = 0;
  pcStack_80 = (code *)0x0;
  local_98 = 0;
  _Stack_90._M_unused._M_object = (void *)0x0;
  local_a8._M_allocated_capacity = 0;
  local_a8._8_8_ = 0;
  name_02.super_string_view._M_str = "VALUE";
  name_02.super_string_view._M_len = 5;
  cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
  ::Bind<std::__cxx11::string>
            ((cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
              *)local_a8._M_local_buf,name_02,0x30);
  name_03.super_string_view._M_str = "VALUE_NAMES";
  name_03.super_string_view._M_len = 0xb;
  cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)&local_a8,name_03,0x50);
  name_04.super_string_view._M_str = "SUBKEYS";
  name_04.super_string_view._M_len = 7;
  cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)&local_a8,name_04,0x51);
  name_05.super_string_view._M_str = "VIEW";
  name_05.super_string_view._M_len = 4;
  cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
  ::Bind<std::__cxx11::string>
            ((cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
              *)local_a8._M_local_buf,name_05,0x58);
  name_06.super_string_view._M_str = "SEPARATOR";
  name_06.super_string_view._M_len = 9;
  cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
  ::Bind<std::__cxx11::string>
            ((cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
              *)local_a8._M_local_buf,name_06,0x78);
  name_07.super_string_view._M_str = "ERROR_VARIABLE";
  name_07.super_string_view._M_len = 0xe;
  cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
  ::Bind<std::__cxx11::string>
            ((cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
              *)local_a8._M_local_buf,name_07,0x98);
  local_1a0._M_allocated_capacity = (size_type)&local_148;
  local_148._M_allocated_capacity = 0;
  local_148._8_8_ = 0;
  local_128.Begin._M_current = local_128.Begin._M_current + 1;
  local_138._M_allocated_capacity = 0;
  local_260._8_8_ = local_270 + 8;
  local_270._8_8_ = (ulong)(uint)local_270._12_4_ << 0x20;
  local_260._M_allocated_capacity = 0;
  local_248 = 0;
  local_238 = 0;
  local_230 = '\0';
  local_220 = 0;
  local_218 = &local_208;
  local_210 = 0;
  local_208 = 0;
  local_1f0 = (pointer)0x0;
  local_1e8 = '\0';
  local_1d8._M_string_length = 0;
  local_1d8.field_2._M_local_buf[0] = '\0';
  local_1b0._8_8_ = local_270;
  local_190 = (undefined1 *)0x0;
  pcStack_188 = (char *)0x0;
  local_180 = 0;
  sStack_178 = 0;
  local_170._M_unused._M_object = (void *)0x0;
  local_170._8_8_ = 0;
  local_160 = (_Manager_type)0x0;
  p_Stack_158 = (_Invoker_type)0x0;
  local_150 = false;
  local_250 = (_Base_ptr)local_260._8_8_;
  local_240 = &local_230;
  local_1f8 = &local_1e8;
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  local_1b0._0_8_ = &local_a8;
  local_1a0._8_8_ = local_1b0._8_8_;
  ArgumentParser::Instance::
  Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((Instance *)local_1b0,&local_128,0);
  if (local_160 != (_Manager_type)0x0) {
    (*local_160)(&local_170,&local_170,__destroy_functor);
  }
  if (local_148._M_allocated_capacity != local_148._8_8_) {
    separator_00._M_str = ", ";
    separator_00._M_len = 2;
    cmJoin(&local_2a0,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_148,separator_00,(string_view)ZEXT816(0));
    local_1b0._0_8_ = (pointer)0x1b;
    local_1b0._8_8_ = "given invalid argument(s) \"";
    local_1a0._M_allocated_capacity = local_2a0._M_string_length;
    local_1a0._8_8_ = local_2a0._M_dataplus._M_p;
    local_190 = &DAT_00000002;
    pcStack_188 = "\".";
    views_00._M_len = 3;
    views_00._M_array = (iterator)local_1b0;
    cmCatViews_abi_cxx11_((string *)&stack0xfffffffffffffd30,views_00);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_fffffffffffffd30._M_p != &local_2c0) {
      operator_delete(in_stack_fffffffffffffd30._M_p,(ulong)(local_2c0._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p,
                      (ulong)(local_2a0.field_2._M_allocated_capacity + 1));
    }
    bVar13 = false;
    goto LAB_001acb54;
  }
  bVar12 = ArgumentParser::ParseResult::MaybeReportError((ParseResult *)local_270,status->Makefile);
  bVar13 = true;
  if (bVar12) goto LAB_001acb54;
  if (local_238 == 0) {
    if (((char)local_220 != '\0') && (local_220._1_1_ == '\x01')) goto LAB_001ac7c1;
LAB_001ac820:
    if ((local_210 == 0) ||
       (name._M_str = in_stack_fffffffffffffd30._M_p, name._M_len = in_stack_fffffffffffffd28,
       oVar10 = cmWindowsRegistry::ToView(name),
       ((ulong)oVar10.super__Optional_base<cmWindowsRegistry::View,_true,_true>._M_payload.
               super__Optional_payload_base<cmWindowsRegistry::View> >> 0x20 & 1) != 0)) {
      local_278 = status->Makefile;
      view._M_value = Both;
      cmMakefile::AddDefinition(local_278,local_1b8,(string_view)(ZEXT816(0x6f6625) << 0x40));
      if (local_210 != 0) {
        name_00._M_str = in_stack_fffffffffffffd30._M_p;
        name_00._M_len = in_stack_fffffffffffffd28;
        oVar10 = cmWindowsRegistry::ToView(name_00);
        view._M_value =
             oVar10.super__Optional_base<cmWindowsRegistry::View,_true,_true>._M_payload.
             super__Optional_payload_base<cmWindowsRegistry::View>._M_payload;
      }
      cmWindowsRegistry::cmWindowsRegistry
                ((cmWindowsRegistry *)&stack0xfffffffffffffd30,local_278,
                 &cmWindowsRegistry::AllTypes);
      if ((char)local_220 == '\x01') {
        key._M_str = pbVar1[4]._M_dataplus._M_p;
        key._M_len = pbVar1[4]._M_string_length;
        cmWindowsRegistry::GetValueNames_abi_cxx11_
                  ((optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_1b0,(cmWindowsRegistry *)&stack0xfffffffffffffd30,key,view._M_value);
        if (local_1a0._M_local_buf[8] == '\x01') {
          separator_01._M_str = ";";
          separator_01._M_len = 1;
          cmJoin(&local_2a0,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1b0,separator_01,(string_view)ZEXT816(0));
          value_26._M_str = local_2a0._M_dataplus._M_p;
          value_26._M_len = local_2a0._M_string_length;
          cmMakefile::AddDefinition(local_278,local_1b8,value_26);
LAB_001aca09:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
            operator_delete(local_2a0._M_dataplus._M_p,
                            (ulong)(local_2a0.field_2._M_allocated_capacity + 1));
          }
        }
LAB_001aca24:
        if (local_1a0._M_local_buf[8] == '\x01') {
          local_1a0._8_8_ = local_1a0._8_8_ & 0xffffffffffffff00;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_1b0);
        }
      }
      else {
        if (local_220._1_1_ == '\x01') {
          key_00._M_str = pbVar1[4]._M_dataplus._M_p;
          key_00._M_len = pbVar1[4]._M_string_length;
          cmWindowsRegistry::GetSubKeys_abi_cxx11_
                    ((optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_1b0,(cmWindowsRegistry *)&stack0xfffffffffffffd30,key_00,view._M_value
                    );
          if (local_1a0._M_local_buf[8] == '\x01') {
            separator_02._M_str = ";";
            separator_02._M_len = 1;
            cmJoin(&local_2a0,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1b0,separator_02,(string_view)ZEXT816(0));
            value_27._M_str = local_2a0._M_dataplus._M_p;
            value_27._M_len = local_2a0._M_string_length;
            cmMakefile::AddDefinition(local_278,local_1b8,value_27);
            goto LAB_001aca09;
          }
          goto LAB_001aca24;
        }
        local_e8._M_dataplus._M_p = local_1f0;
        local_e8._M_string_length = (size_type)local_1f8;
        separator._M_str = local_1f8;
        separator._M_len = (size_t)local_1f0;
        key_01._M_str = pbVar1[4]._M_dataplus._M_p;
        key_01._M_len = pbVar1[4]._M_string_length;
        name_01._M_str = local_240;
        name_01._M_len = local_238;
        cmWindowsRegistry::ReadValue_abi_cxx11_
                  ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_1b0,(cmWindowsRegistry *)&stack0xfffffffffffffd30,key_01,name_01,
                   view._M_value,separator);
        if (local_190._0_1_ == true) {
          value_28._M_str = (char *)local_1b0._0_8_;
          value_28._M_len = local_1b0._8_8_;
          cmMakefile::AddDefinition(local_278,local_1b8,value_28);
        }
        if ((local_190._0_1_ == true) &&
           (local_190 = (undefined1 *)((ulong)local_190 & 0xffffffffffffff00),
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_1b0._0_8_ != &local_1a0)) {
          operator_delete((void *)local_1b0._0_8_,(ulong)(local_1a0._M_allocated_capacity + 1));
        }
      }
      if (local_1d8._M_string_length != 0) {
        sVar14 = cmWindowsRegistry::GetLastError((cmWindowsRegistry *)&stack0xfffffffffffffd30);
        cmMakefile::AddDefinition(local_278,&local_1d8,sVar14);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)in_stack_fffffffffffffd30._M_p != &local_2c0) {
        operator_delete(in_stack_fffffffffffffd30._M_p,(ulong)(local_2c0._M_allocated_capacity + 1))
        ;
      }
      goto LAB_001acb54;
    }
    local_1b0._0_8_ = (pointer)0x20;
    local_1b0._8_8_ = "given invalid value for \"VIEW\": ";
    local_108 = (char *)CONCAT71(local_108._1_7_,0x2e);
    cmStrCat<char>(&local_2a0,(cmAlphaNum *)local_1b0,(cmAlphaNum *)&stack0xfffffffffffffd30,
                   (char *)&local_108);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
LAB_001ac811:
      operator_delete(local_2a0._M_dataplus._M_p,
                      (ulong)(local_2a0.field_2._M_allocated_capacity + 1));
    }
  }
  else {
    if (((char)local_220 == '\0') && (local_220._1_1_ == '\0')) goto LAB_001ac820;
LAB_001ac7c1:
    local_1b0._0_8_ = &local_1a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,
               "given mutually exclusive sub-options \"VALUE\", \"VALUE_NAMES\" or \"SUBKEYS\".","")
    ;
    std::__cxx11::string::_M_assign((string *)&status->Error);
    local_2a0.field_2._M_allocated_capacity = local_1a0._M_allocated_capacity;
    local_2a0._M_dataplus._M_p = (pointer)local_1b0._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._0_8_ != &local_1a0) goto LAB_001ac811;
  }
  bVar13 = false;
LAB_001acb54:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,
                    CONCAT71(local_1d8.field_2._M_allocated_capacity._1_7_,
                             local_1d8.field_2._M_local_buf[0]) + 1);
  }
  if (local_1f8 != &local_1e8) {
    operator_delete(local_1f8,CONCAT71(uStack_1e7,local_1e8) + 1);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218,CONCAT71(uStack_207,local_208) + 1);
  }
  if (local_240 != &local_230) {
    operator_delete(local_240,CONCAT71(uStack_22f,local_230) + 1);
  }
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_270);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_148);
  std::
  vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ::~vector(&vStack_50);
  if (pcStack_60 != (code *)0x0) {
    (*pcStack_60)(&_Stack_70,&_Stack_70,__destroy_functor);
  }
  if (pcStack_80 != (code *)0x0) {
    (*pcStack_80)(&_Stack_90,&_Stack_90,__destroy_functor);
  }
  std::
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  ::~vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
             *)&local_a8);
  return bVar13;
}

Assistant:

bool cmCMakeHostSystemInformationCommand(std::vector<std::string> const& args,
                                         cmExecutionStatus& status)
{
  std::size_t current_index = 0;

  if (args.size() < (current_index + 2) || args[current_index] != "RESULT"_s) {
    status.SetError("missing RESULT specification.");
    return false;
  }

  auto const& variable = args[current_index + 1];
  current_index += 2;

  if (args.size() < (current_index + 2) || args[current_index] != "QUERY"_s) {
    status.SetError("missing QUERY specification");
    return false;
  }

  if (args[current_index + 1] == "WINDOWS_REGISTRY"_s) {
    return QueryWindowsRegistry(cmMakeRange(args).advance(current_index + 2),
                                status, variable);
  }

  static cmsys::SystemInformation info;
  static auto initialized = false;
  if (!initialized) {
    info.RunCPUCheck();
    info.RunOSCheck();
    info.RunMemoryCheck();
    initialized = true;
  }

  std::string result_list;
  for (auto i = current_index + 1; i < args.size(); ++i) {
    result_list += DELIM[!result_list.empty()];

    auto const& key = args[i];
    // clang-format off
    auto value =
      GetValueChained(
          [&]() { return GetValue(info, key); }
        , [&]() { return GetValue(status, key, variable); }
#ifdef HAVE_VS_SETUP_HELPER
        , [&]() { return GetValue(status, key); }
#endif
        );
    // clang-format on
    if (!value) {
      status.SetError("does not recognize <key> " + key);
      return false;
    }
    result_list += value.value();
  }

  status.GetMakefile().AddDefinition(variable, result_list);

  return true;
}